

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutualInformation.cpp
# Opt level: O3

void __thiscall MutualInformation::loadFeatures(MutualInformation *this)

{
  _WordT *p_Var1;
  proto_child0 __nptr;
  char cVar2;
  int iVar3;
  size_t *__s;
  istream *piVar4;
  size_t sVar5;
  int *piVar6;
  long lVar7;
  size_t sVar8;
  long *plVar9;
  ulong uVar10;
  string *psVar11;
  ulong uVar12;
  ulong extraout_RDX;
  int iVar13;
  ulong uVar14;
  string *this_00;
  int numOfFeatures;
  int degreeOfInteractions;
  string line;
  string rootName;
  string attrName;
  string typeOfFeature;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  stringstream ssLine;
  ifstream input;
  int local_4a4;
  undefined1 local_4a0 [8];
  string *local_498;
  undefined1 local_490 [16];
  long lStack_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  char local_468 [16];
  string local_458;
  string local_438;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::int_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_418;
  undefined1 local_408 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8 [2];
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3d8;
  undefined4 *local_3d0 [2];
  undefined1 local_3c0 [128];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  __s = (size_t *)operator_new__(800);
  memset(__s,0,800);
  this->_queryRootIndex = __s;
  std::ifstream::ifstream
            ((istream *)local_238,(string *)multifaq::config::FEATURE_CONF_abi_cxx11_,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   multifaq::config::FEATURE_CONF_abi_cxx11_," does not exist. \n");
    std::operator<<((ostream *)&std::cerr,(string *)local_3c0);
    this_00 = (string *)local_3c0;
LAB_001a2475:
    std::__cxx11::string::~string(this_00);
LAB_001a247a:
    exit(1);
  }
  local_478._M_allocated_capacity = (size_type)local_468;
  local_478._8_8_ = 0;
  local_468[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
  local_4a0._0_4_ = 0;
  local_4a0._4_4_ = 0;
  do {
    do {
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)local_478._M_local_buf,cVar2);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) goto LAB_001a1f64;
    } while (*(char *)local_478._M_allocated_capacity == '#');
    iVar3 = std::__cxx11::string::compare(local_478._M_local_buf);
  } while (iVar3 == 0);
LAB_001a1f64:
  local_498 = (string *)local_4a0;
  local_458._M_string_length = (size_type)&local_498;
  local_418.child0 = (proto_child0)&local_458;
  local_458._M_dataplus._M_p = &boost::spirit::int_;
  local_438._M_dataplus._M_p = (pointer)&local_418;
  local_418.child1.child0 = ",";
  local_3d0[0] = (undefined4 *)(local_4a0 + 4);
  local_3f8[0]._8_8_ = local_3d0;
  local_438._M_string_length = (size_type)(local_408 + 0x10);
  local_3f8[0]._M_allocated_capacity = &boost::spirit::int_;
  local_3d8._M_current = (char *)local_478._M_allocated_capacity;
  boost::spirit::qi::detail::
  phrase_parse_impl<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::int_>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<int>>,0l>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::int_>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<int>>,0l>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>const&>,2l>const&>,2l>,void>
  ::
  call<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>>
            (&local_3d8,(char *)(local_478._M_allocated_capacity + local_478._8_8_),
             (expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::int_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::int_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_2L>
              *)&local_438,
             (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>
              *)&boost::spirit::ascii::space,postskip);
  if (0 < (int)local_4a0._0_4_) {
    local_4a4 = 0;
    do {
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)local_478._M_local_buf,cVar2);
      if (*(char *)local_478._M_allocated_capacity != '#') {
        iVar3 = std::__cxx11::string::compare(local_478._M_local_buf);
        if (iVar3 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_3c0 + 0x10),(char *)local_478._M_allocated_capacity,
                     local_478._8_8_);
          local_438._M_string_length = 0;
          local_438.field_2._M_local_buf[0] = '\0';
          local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_3c0,(string *)&local_438,':');
          local_418.child1.child0 = (char *)0x0;
          local_408[0] = 0;
          local_418.child0 = (proto_child0)local_408;
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_3c0,(string *)&local_418,':');
          local_458._M_string_length = 0;
          local_458.field_2._M_local_buf[0] = '\0';
          local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_3c0,(string *)&local_458,':');
          sVar5 = TreeDecomposition::getAttributeIndex
                            ((this->_td).
                             super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,&local_438);
          __nptr = local_418.child0;
          piVar6 = __errno_location();
          iVar3 = *piVar6;
          *piVar6 = 0;
          lVar7 = strtol((char *)__nptr,(char **)&local_498,10);
          if (local_498 != (string *)__nptr) {
            iVar13 = (int)lVar7;
            if ((iVar13 == lVar7) && (*piVar6 != 0x22)) {
              if (*piVar6 == 0) {
                *piVar6 = iVar3;
              }
              sVar8 = TreeDecomposition::getRelationIndex
                                ((this->_td).
                                 super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,&local_458);
              if ((int)sVar5 == -1) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_408 + 0x10),"Attribute |",&local_438);
                plVar9 = (long *)std::__cxx11::string::append(local_408 + 0x10);
                local_498 = (string *)*plVar9;
                psVar11 = (string *)(plVar9 + 2);
                if (local_498 == psVar11) {
                  local_490._8_8_ = (psVar11->_M_dataplus)._M_p;
                  lStack_480 = plVar9[3];
                  local_498 = (string *)(local_490 + 8);
                }
                else {
                  local_490._8_8_ = (psVar11->_M_dataplus)._M_p;
                }
                local_490._0_8_ = plVar9[1];
                *plVar9 = (long)psVar11;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                std::operator<<((ostream *)&std::cerr,(string *)&local_498);
              }
              else {
                if ((int)sVar8 != -1) {
                  if (iVar13 != 1 || local_4a4 != 0) {
                    uVar12 = (ulong)(int)sVar5;
                    if (99 < uVar12) goto LAB_001a233e;
                    uVar14 = 1L << ((byte)sVar5 & 0x3f);
                    uVar10 = uVar12 >> 6;
                    p_Var1 = (this->super_Application)._isFeature.super__Base_bitset<2UL>._M_w +
                             uVar10;
                    *p_Var1 = *p_Var1 | uVar14;
                    p_Var1 = (this->super_Application)._features.super__Base_bitset<2UL>._M_w +
                             uVar10;
                    *p_Var1 = *p_Var1 | uVar14;
                    if (iVar13 == 0) {
                      this->_queryRootIndex[uVar12] =
                           ((this->_td).
                            super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           )->_root->_id;
                    }
                    else {
                      this->_queryRootIndex[uVar12] = (long)(int)sVar8;
                      p_Var1 = (this->super_Application)._isCategoricalFeature.
                               super__Base_bitset<2UL>._M_w + uVar10;
                      *p_Var1 = *p_Var1 | uVar14;
                    }
                    std::ios::clear((int)*(undefined8 *)(local_3c0._0_8_ + -0x18) + (int)local_3c0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_458._M_dataplus._M_p != &local_458.field_2) {
                      operator_delete(local_458._M_dataplus._M_p);
                    }
                    if ((string *)local_418.child0 != (string *)local_408) {
                      operator_delete(local_418.child0);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_438._M_dataplus._M_p != &local_438.field_2) {
                      operator_delete(local_438._M_dataplus._M_p);
                    }
                    local_4a4 = local_4a4 + 1;
                    goto LAB_001a226f;
                  }
                  std::operator<<((ostream *)&std::cerr,"The label needs to be continuous! ");
                  goto LAB_001a247a;
                }
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_408 + 0x10),"Relation |",&local_458);
                plVar9 = (long *)std::__cxx11::string::append(local_408 + 0x10);
                local_498 = (string *)*plVar9;
                psVar11 = (string *)(plVar9 + 2);
                if (local_498 == psVar11) {
                  local_490._8_8_ = (psVar11->_M_dataplus)._M_p;
                  lStack_480 = plVar9[3];
                  local_498 = (string *)(local_490 + 8);
                }
                else {
                  local_490._8_8_ = (psVar11->_M_dataplus)._M_p;
                }
                local_490._0_8_ = plVar9[1];
                *plVar9 = (long)psVar11;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                std::operator<<((ostream *)&std::cerr,(string *)&local_498);
              }
              std::__cxx11::string::~string((string *)&local_498);
              this_00 = (string *)(local_408 + 0x10);
              goto LAB_001a2475;
            }
            std::__throw_out_of_range("stoi");
          }
          std::__throw_invalid_argument("stoi");
          uVar12 = extraout_RDX;
LAB_001a233e:
          std::__throw_out_of_range_fmt
                    ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar12,100)
          ;
        }
      }
LAB_001a226f:
    } while (local_4a4 < (int)local_4a0._0_4_);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
  std::ios_base::~ios_base(local_340);
  if ((char *)local_478._M_allocated_capacity != local_468) {
    operator_delete((void *)local_478._M_allocated_capacity);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void MutualInformation::loadFeatures()
{
    _queryRootIndex = new size_t[NUM_OF_VARIABLES]();
    
    /* Load the two-pass variables config file into an input stream. */
    ifstream input(FEATURE_CONF);

    if (!input)
    {
        ERROR(FEATURE_CONF+" does not exist. \n");
        exit(1);
    }

    /* String and associated stream to receive lines from the file. */
    string line;
    stringstream ssLine;

    int numOfFeatures = 0;
    int degreeOfInteractions = 0;
    
    /* Ignore comment and empty lines at the top */
    while (getline(input, line))
    {
        if (line[0] == COMMENT_CHAR || line == "")
            continue;

        break;
    }
    
    /* 
     * Extract number of labels, features and interactions from the config. 
     * Parse the line with the three numbers; ignore spaces. 
     */
    bool parsingSuccess =
        qi::phrase_parse(line.begin(), line.end(),
                         /* Begin Boost Spirit grammar. */
                         ((qi::int_[phoenix::ref(numOfFeatures) = qi::_1])
                          >> NUMBER_SEPARATOR_CHAR
                          >> (qi::int_[phoenix::ref(degreeOfInteractions) =
                                       qi::_1])),
                         /*  End grammar. */
                         ascii::space);

    assert(parsingSuccess && "The parsing of the features file has failed.");
    
    /* Read in the features. */
    for (int featureNo = 0; featureNo < numOfFeatures; ++featureNo)
    {
        getline(input, line);
        if (line[0] == COMMENT_CHAR || line == "")
        {
            --featureNo;
            continue;
        }

        ssLine << line;
 
        string attrName;
        /* Extract the name of the attribute in the current line. */
        getline(ssLine, attrName, ATTRIBUTE_NAME_CHAR);

        string typeOfFeature;
        /* Extract the dimension of the current attribute. */
        getline(ssLine, typeOfFeature, ATTRIBUTE_NAME_CHAR);

        string rootName;
        /* Extract the dimension of the current attribute. */
        getline(ssLine, rootName, ATTRIBUTE_NAME_CHAR);

        int attributeID = _td->getAttributeIndex(attrName);
        int categorical = stoi(typeOfFeature); 
        int rootID = _td->getRelationIndex(rootName);

        if (attributeID == -1)
        {
            ERROR("Attribute |"+attrName+"| does not exist.");
            exit(1);
        }
        if (rootID == -1)
        {
            ERROR("Relation |"+rootName+"| does not exist.");
            exit(1);
        }
        if (featureNo == 0 && categorical == 1)
        {
            ERROR("The label needs to be continuous! ");
            exit(1);
        }

        _isFeature.set(attributeID);
        _features.set(attributeID);

        if (categorical)
        {
            _queryRootIndex[attributeID] = rootID;
            _isCategoricalFeature.set(attributeID);
        }
        else
        {
            _queryRootIndex[attributeID] = _td->_root->_id;
        }

        /* Clear string stream. */
        ssLine.clear();
    }
}